

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoaderU.h
# Opt level: O1

shared_ptr<chrono::ChLoadable> __thiscall chrono::ChLoaderU::GetLoadable(ChLoaderU *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  shared_ptr<chrono::ChLoadable> sVar3;
  shared_ptr<chrono::ChLoadable> sVar4;
  
  peVar2 = (this->loadable).super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar2 == (element_type *)0x0) {
    peVar2 = (element_type *)0x0;
  }
  else {
    in_RDX._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)peVar2;
    peVar2 = peVar2 + *(long *)&in_RDX._M_pi[-8]._M_use_count;
  }
  *(element_type **)in_RDI = peVar2;
  p_Var1 = (this->loadable).super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RDI + 8) = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      sVar3.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar3.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (shared_ptr<chrono::ChLoadable>)
             sVar3.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  sVar4.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar4.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<chrono::ChLoadable>)
         sVar4.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<ChLoadable> GetLoadable() override { return loadable; }